

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_connection.cc
# Opt level: O1

void __thiscall iqnet::ssl::Connection::Connection(Connection *this,Socket *s)

{
  Ctx *this_00;
  int iVar1;
  SSL_CTX *ctx;
  SSL *s_00;
  exception *this_01;
  pointer_____offset_0x10___ *ppuVar2;
  
  iqnet::Connection::Connection(&this->super_Connection,s);
  (this->super_Connection).super_Event_handler._vptr_Event_handler =
       (_func_int **)&PTR__Connection_0018b720;
  this_00 = ssl::ctx;
  this->ssl_ctx = ssl::ctx;
  if (this_00 == (Ctx *)0x0) {
    this_01 = (exception *)__cxa_allocate_exception(0x30);
    not_initialized::not_initialized((not_initialized *)this_01);
    ppuVar2 = &not_initialized::typeinfo;
  }
  else {
    ctx = (SSL_CTX *)Ctx::context(this_00);
    s_00 = SSL_new(ctx);
    this->ssl = (SSL *)s_00;
    if (s_00 != (SSL *)0x0) {
      iVar1 = SSL_set_fd(s_00,(this->super_Connection).sock.sock);
      if (iVar1 != 0) {
        return;
      }
    }
    this_01 = (exception *)__cxa_allocate_exception(0x30);
    exception::exception(this_01);
    ppuVar2 = &exception::typeinfo;
  }
  __cxa_throw(this_01,ppuVar2,exception::~exception);
}

Assistant:

ssl::Connection::Connection( const Socket& s ):
  iqnet::Connection( s ),
  ssl_ctx( ssl::ctx )
{
  if( !ssl_ctx )
    throw ssl::not_initialized();

  ssl = SSL_new( ssl_ctx->context() );

  if( !ssl )
    throw ssl::exception();

  if( !SSL_set_fd( ssl, static_cast<int>(sock.get_handler()) ) )
    throw ssl::exception();
}